

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::Block::Block(Block *this)

{
  (this->label)._M_dataplus._M_p = (pointer)&(this->label).field_2;
  (this->label)._M_string_length = 0;
  (this->label).field_2._M_local_buf[0] = '\0';
  FuncDeclaration::FuncDeclaration(&this->decl);
  (this->end_loc).filename._M_str = (char *)0x0;
  (this->end_loc).field_1.field_1.offset = 0;
  (this->exprs).size_ = 0;
  (this->end_loc).filename._M_len = 0;
  (this->exprs).first_ = (Expr *)0x0;
  (this->exprs).last_ = (Expr *)0x0;
  (this->end_loc).field_1.field_0.last_column = 0;
  return;
}

Assistant:

Block() = default;